

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O3

QMap<int,_QVariant> __thiscall GenericModel::itemData(GenericModel *this,QModelIndex *index)

{
  _Rb_tree_header *p_Var1;
  int *piVar2;
  QVariant *this_00;
  _Base_ptr p_Var3;
  int *in_RDX;
  _Base_ptr p_Var4;
  RolesContainer rawData;
  QMap<int,_QVariant> local_20;
  int local_14;
  
  if (((*in_RDX < 0) || (in_RDX[1] < 0)) || (*(long *)(in_RDX + 4) == 0)) {
    *(undefined8 *)this = 0;
    return (QMap<int,_QVariant>)this;
  }
  if (index->m[0x48] == (QAbstractItemModel)0x0) {
    piVar2 = *(int **)(*(long *)(in_RDX + 2) + 0x10);
    *(int **)this = piVar2;
    if (piVar2 == (int *)0x0) {
      return (QMap<int,_QVariant>)this;
    }
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
    return (QMap<int,_QVariant>)this;
  }
  local_20.d.d = *(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                   *)(*(long *)(in_RDX + 2) + 0x10);
  if (local_20.d.d !=
      (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
       *)0x0) {
    LOCK();
    (((QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
       *)local_20.d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
            *)local_20.d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (local_20.d.d !=
        (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
         *)0x0) {
      p_Var4 = (((QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                  *)local_20.d.d)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var4 == (_Base_ptr)0x0) {
        *(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          *)this = local_20.d.d;
      }
      else {
        p_Var1 = &(((QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)local_20.d.d)->m)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = &p_Var1->_M_header;
        do {
          if (-1 < (int)p_Var4[1]._M_color) {
            p_Var3 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[p_Var4[1]._M_color >> 0x1f];
        } while (p_Var4 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var3 != p_Var1) && ((int)p_Var3[1]._M_color < 1)) {
          local_14 = 2;
          this_00 = QMap<int,_QVariant>::operator[](&local_20,&local_14);
          ::QVariant::operator=(this_00,(QVariant *)&p_Var3[1]._M_parent);
        }
        *(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          *)this = local_20.d.d;
        if (local_20.d.d ==
            (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
             *)0x0) goto LAB_0012fb48;
      }
      LOCK();
      *(int *)local_20.d.d = *(int *)local_20.d.d + 1;
      UNLOCK();
      goto LAB_0012fb48;
    }
  }
  *(undefined8 *)this = 0;
LAB_0012fb48:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_20.d);
  return (QMap<int,_QVariant>)
         (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )this;
}

Assistant:

QMap<int, QVariant> GenericModel::itemData(const QModelIndex &index) const
{
    if (!index.isValid())
        return QMap<int, QVariant>();
    Q_ASSERT(index.model() == this);
    Q_D(const GenericModel);
    if (!d->m_mergeDisplayEdit)
        return convertFromContainer<QMap<int, QVariant>>(d->itemForIndex(index)->data);
    RolesContainer rawData = d->itemForIndex(index)->data;
    const auto displayIter = rawData.constFind(Qt::DisplayRole);
    if (displayIter != rawData.constEnd())
        rawData[Qt::EditRole] = displayIter.value();
    return convertFromContainer<QMap<int, QVariant>>(rawData);
}